

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

NotificationHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *f)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_30;
  
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_30,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this);
  notificationHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)&local_30,method);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle GetHandle(std::function<void(ParamTypes...)> f) {
    return notificationHandle(f);
  }